

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall CLIntercept::checkRemoveKernelInfo(CLIntercept *this,cl_kernel kernel)

{
  cl_uint cVar1;
  cl_kernel local_20;
  
  local_20 = kernel;
  std::mutex::lock(&this->m_Mutex);
  cVar1 = getRefCount(this,kernel);
  if (cVar1 == 1) {
    std::
    _Rb_tree<_cl_kernel_*,_std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>,_std::_Select1st<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
    ::erase(&(this->m_KernelInfoMap)._M_t,&local_20);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void CLIntercept::checkRemoveKernelInfo( cl_kernel kernel )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_uint refCount = getRefCount( kernel );
    if( refCount == 1 )
    {
#if 0
        // We shouldn't remove the kernel name from the local kernel name map
        // here since the mapping may be included in the device performance
        // time report.
        m_LongKernelNameMap.erase( m_KernelInfoMap[ kernel ].KernelName );
#endif

        m_KernelInfoMap.erase( kernel );
    }
}